

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

STL * cacheSurface(STL *__return_storage_ptr__,ImportedUgrid *ugrid,
                  set<int,_std::less<int>,_std::allocator<int>_> *tags)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  Facet local_2d0;
  Point<double> local_270;
  Point<double> local_258;
  Point<double> local_240;
  Facet local_228;
  Point<double> local_1c8;
  Point<double> local_1b0;
  Point<double> local_198;
  const_reference local_180;
  double *p_1;
  array<Parfait::Point<double>,_3UL> facet_1;
  int tag_1;
  value_type *quad;
  undefined1 local_118 [4];
  int q;
  Point<double> local_b8;
  const_reference local_a0;
  double *p;
  int n;
  int i;
  array<Parfait::Point<double>,_3UL> facet;
  value_type local_34;
  const_reference pvStack_30;
  int tag;
  value_type *tri;
  int t;
  set<int,_std::less<int>,_std::allocator<int>_> *tags_local;
  ImportedUgrid *ugrid_local;
  STL *stl;
  
  tri._7_1_ = 0;
  _t = tags;
  tags_local = (set<int,_std::less<int>,_std::allocator<int>_> *)ugrid;
  ugrid_local = (ImportedUgrid *)__return_storage_ptr__;
  Parfait::STL::STL::STL(__return_storage_ptr__);
  for (tri._0_4_ = 0; uVar1 = (ulong)(int)tri,
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &tags_local[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
      uVar1 < sVar2 / 3; tri._0_4_ = (int)tri + 1) {
    pvStack_30 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &tags_local[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                            (long)((int)tri * 3));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &tags_local[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                        (long)(int)tri);
    local_34 = *pvVar3;
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(_t,&local_34);
    if (sVar4 != 0) {
      for (p._4_4_ = 0; p._4_4_ < 3; p._4_4_ = p._4_4_ + 1) {
        p._0_4_ = pvStack_30[p._4_4_];
        local_a0 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)tags_local,
                              (long)((int)p * 3));
        Parfait::Point<double>::Point(&local_b8,*local_a0,local_a0[1],local_a0[2]);
        pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                           ((array<Parfait::Point<double>,_3UL> *)&n,(long)p._4_4_);
        (pvVar5->pos)._M_elems[0] = local_b8.pos._M_elems[0];
        (pvVar5->pos)._M_elems[1] = local_b8.pos._M_elems[1];
        (pvVar5->pos)._M_elems[2] = local_b8.pos._M_elems[2];
      }
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&n,0);
      pvVar6 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&n,1);
      pvVar7 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&n,2);
      Parfait::Facet::Facet((Facet *)local_118,pvVar5,pvVar6,pvVar7);
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::push_back
                (&__return_storage_ptr__->facets,(value_type *)local_118);
    }
  }
  for (quad._4_4_ = 0;
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(tags_local + 2)),
      (ulong)(long)quad._4_4_ < sVar2 >> 2; quad._4_4_ = quad._4_4_ + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(tags_local + 2),
                        (long)(quad._4_4_ << 2));
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(tags_local + 5),(long)quad._4_4_);
    facet_1._M_elems[2].pos._M_elems[2]._4_4_ = *pvVar8;
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (_t,(key_type *)((long)facet_1._M_elems[2].pos._M_elems + 0x14));
    if (sVar4 != 0) {
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(*pvVar3 * 3));
      Parfait::Point<double>::Point(&local_198,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,0);
      (pvVar5->pos)._M_elems[2] = local_198.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_198.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_198.pos._M_elems[1];
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(pvVar3[1] * 3));
      Parfait::Point<double>::Point(&local_1b0,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,1);
      (pvVar5->pos)._M_elems[2] = local_1b0.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_1b0.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_1b0.pos._M_elems[1];
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(pvVar3[2] * 3));
      Parfait::Point<double>::Point(&local_1c8,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,2);
      (pvVar5->pos)._M_elems[2] = local_1c8.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_1c8.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_1c8.pos._M_elems[1];
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,0);
      pvVar6 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,1);
      pvVar7 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,2);
      Parfait::Facet::Facet(&local_228,pvVar5,pvVar6,pvVar7);
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::push_back
                (&__return_storage_ptr__->facets,&local_228);
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(pvVar3[2] * 3));
      Parfait::Point<double>::Point(&local_240,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,2);
      (pvVar5->pos)._M_elems[2] = local_240.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_240.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_240.pos._M_elems[1];
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(pvVar3[3] * 3));
      Parfait::Point<double>::Point(&local_258,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,3);
      (pvVar5->pos)._M_elems[2] = local_258.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_258.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_258.pos._M_elems[1];
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)tags_local,
                             (long)(*pvVar3 * 3));
      Parfait::Point<double>::Point(&local_270,*local_180,local_180[1],local_180[2]);
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,0);
      (pvVar5->pos)._M_elems[2] = local_270.pos._M_elems[2];
      (pvVar5->pos)._M_elems[0] = local_270.pos._M_elems[0];
      (pvVar5->pos)._M_elems[1] = local_270.pos._M_elems[1];
      pvVar5 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,0);
      pvVar6 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,1);
      pvVar7 = std::array<Parfait::Point<double>,_3UL>::operator[]
                         ((array<Parfait::Point<double>,_3UL> *)&p_1,2);
      Parfait::Facet::Facet(&local_2d0,pvVar5,pvVar6,pvVar7);
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::push_back
                (&__return_storage_ptr__->facets,&local_2d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto cacheSurface(const Parfait::ImportedUgrid& ugrid, const std::set<int>& tags) {
    Parfait::STL::STL stl;
    for(int t = 0; t < ugrid.triangles.size() / 3; t++) {
        auto tri = &ugrid.triangles[3 * t + 0];
        int tag = ugrid.triangleTags[t];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            for (int i = 0; i < 3; i++) {
                int n = tri[i];
                const double *p = &ugrid.nodes[3 * n + 0];
                facet[i] = Parfait::Point<double>(p[0], p[1], p[2]);
            }
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }

    for(int q = 0; q < ugrid.quads.size() / 4; q++) {
        auto quad = &ugrid.quads[4 * q + 0];
        int tag = ugrid.quadTags[q];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            const double *p;
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[1] + 0];
            facet[1] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});

            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[3] + 0];
            facet[3] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }
    return stl;
}